

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentTrumpRule.h
# Opt level: O2

bool __thiscall DifferentTrumpRule::isTrump(DifferentTrumpRule *this,bool previous,Card *card)

{
  bool bVar1;
  _Vector_base<Card,_std::allocator<Card>_> _Stack_28;
  
  std::vector<Card,_std::allocator<Card>_>::vector
            ((vector<Card,_std::allocator<Card>_> *)&_Stack_28,&this->m_trumpCards);
  bVar1 = contains<Card>((vector<Card,_std::allocator<Card>_> *)&_Stack_28,*card);
  std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base(&_Stack_28);
  return bVar1;
}

Assistant:

virtual bool isTrump(bool previous, const Card &card){
        return contains(m_trumpCards, card);
    }